

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O0

vbignum_t * __thiscall vbignum_t::operator*(vbignum_t *this,vbignum_t *b)

{
  uint uVar1;
  vbignum_t *this_00;
  char *in_stack_00000020;
  char *in_stack_00000028;
  vbignum_t *res;
  vbignum_t *in_stack_ffffffffffffffb8;
  vbignum_t *this_01;
  
  this_00 = (vbignum_t *)operator_new(8);
  vbignum_t(this_00);
  this_01 = this_00;
  uVar1 = maxprec(this_00,in_stack_ffffffffffffffb8);
  init(this_01,(EVP_PKEY_CTX *)(ulong)uVar1);
  CVmObjBigNum::compute_prod_into((char *)res,in_stack_00000028,in_stack_00000020);
  return this_00;
}

Assistant:

vbignum_t *operator *(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t();
        res->init(maxprec(this, &b));
        CVmObjBigNum::compute_prod_into(res->ext_, ext_, b.ext_);
        return res;
    }